

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::
Vector<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
::setCapacity(Vector<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
              *this,size_t newSize)

{
  long lVar1;
  Entry *pEVar2;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat>_>::Entry>
  *pRVar3;
  Entry *pEVar4;
  ulong uVar5;
  ulong uVar6;
  ArrayBuilder<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>::Entry>
  newBuilder;
  ArrayBuilder<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>::Entry>
  local_48;
  
  lVar1 = *(long *)this;
  uVar6 = *(ulong *)(this + 8);
  uVar5 = ((long)(uVar6 - lVar1) >> 3) * 0x6db6db6db6db6db7;
  if (newSize <= uVar5 && uVar5 - newSize != 0) {
    while (lVar1 + newSize * 0x38 < uVar6) {
      *(Entry **)(this + 8) = (Entry *)(uVar6 - 0x38);
      HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>
      ::Entry::~Entry((Entry *)(uVar6 - 0x38));
      uVar6 = *(ulong *)(this + 8);
    }
  }
  local_48.ptr = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                    (0x38,0,newSize,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
  local_48.endPtr = (Entry *)(newSize * 0x38 + (long)local_48.ptr);
  local_48.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_48.pos = local_48.ptr;
  local_48.pos = kj::_::
                 CopyConstructArray_<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,_kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry_*,_true,_false>
                 ::apply(local_48.ptr,*(Entry **)this,*(Entry **)(this + 8));
  ArrayBuilder<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
  ::operator=((ArrayBuilder<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
               *)this,&local_48);
  pEVar4 = local_48.endPtr;
  pRVar3 = local_48.pos;
  pEVar2 = local_48.ptr;
  if (local_48.ptr != (Entry *)0x0) {
    local_48.ptr = (Entry *)0x0;
    local_48.pos = (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat>_>::Entry>
                    *)0x0;
    local_48.endPtr = (Entry *)0x0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)
              (local_48.disposer,pEVar2,0x38,((long)pRVar3 - (long)pEVar2 >> 3) * 0x6db6db6db6db6db7
               ,((long)pEVar4 - (long)pEVar2 >> 3) * 0x6db6db6db6db6db7,
               ArrayDisposer::
               Dispose_<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
               ::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }